

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_register_handler(int signum,int oneshot)

{
  int iVar1;
  int *piVar2;
  undefined1 local_b0 [8];
  sigaction sa;
  int oneshot_local;
  int signum_local;
  
  sa.sa_restorer._4_4_ = oneshot;
  memset(local_b0,0,0x98);
  iVar1 = sigfillset((sigset_t *)&sa);
  if (iVar1 != 0) {
    abort();
  }
  local_b0 = (undefined1  [8])uv__signal_handler;
  sa.sa_mask.__val[0xf]._0_4_ = 0x10000000;
  if (sa.sa_restorer._4_4_ != 0) {
    sa.sa_mask.__val[0xf]._0_4_ = 0x90000000;
  }
  iVar1 = sigaction(signum,(sigaction *)local_b0,(sigaction *)0x0);
  if (iVar1 == 0) {
    oneshot_local = 0;
  }
  else {
    piVar2 = __errno_location();
    oneshot_local = -*piVar2;
  }
  return oneshot_local;
}

Assistant:

static int uv__signal_register_handler(int signum, int oneshot) {
  /* When this function is called, the signal lock must be held. */
  struct sigaction sa;

  /* XXX use a separate signal stack? */
  memset(&sa, 0, sizeof(sa));
  if (sigfillset(&sa.sa_mask))
    abort();
  sa.sa_handler = uv__signal_handler;
  sa.sa_flags = SA_RESTART;
  if (oneshot)
    sa.sa_flags |= SA_RESETHAND;

  /* XXX save old action so we can restore it later on? */
  if (sigaction(signum, &sa, NULL))
    return UV__ERR(errno);

  return 0;
}